

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O3

shared_ptr<Storage::Disk::Track>
GTrackWithSectors<FMEncoder>
          (vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
           *sectors,size_t post_index_address_mark_bytes,uint8_t post_index_address_mark_value,
          size_t pre_address_mark_bytes,size_t post_address_mark_bytes,
          uint8_t post_address_mark_value,size_t pre_data_mark_bytes,size_t post_data_bytes,
          uint8_t post_data_value,size_t expected_track_bytes)

{
  long lVar1;
  uint8_t *puVar2;
  uint8_t input;
  vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
  *pvVar3;
  unsigned_short uVar4;
  int c;
  long lVar5;
  ulong uVar6;
  long *plVar7;
  uint uVar8;
  unsigned_short *puVar9;
  byte fuzzy_mask;
  int iVar10;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  ushort uVar12;
  undefined8 *puVar13;
  byte bVar14;
  undefined7 in_register_00000089;
  vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
  *__range1;
  ulong uVar15;
  ulong uVar16;
  shared_ptr<Storage::Disk::Track> sVar17;
  undefined7 in_stack_00000019;
  ulong in_stack_00000028;
  undefined1 local_2f9;
  ulong local_2f8;
  ulong local_2f0;
  vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
  *local_2e8;
  undefined8 *local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  ulong local_2c8;
  size_type local_2c0;
  PCMTrack *local_2b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2b0;
  PCMSegment local_2a8;
  FMEncoder local_250;
  
  uVar15 = CONCAT71(in_register_00000089,post_address_mark_value);
  uVar16 = CONCAT71(in_register_00000011,post_index_address_mark_value);
  local_2f8 = CONCAT44(local_2f8._4_4_,(int)pre_address_mark_bytes);
  local_2a8.length_of_a_bit.length = 1;
  local_2a8.length_of_a_bit.clock_rate = 1;
  local_2a8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_2a8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  local_2a8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_2a8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  local_2a8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_2a8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  local_2a8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_2a8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_2a8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_2a8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  local_2c0 = in_stack_00000028 * 8;
  local_2e8 = sectors;
  std::vector<bool,_std::allocator<bool>_>::reserve(&local_2a8.data,local_2c0);
  local_2d8 = CONCAT71(in_stack_00000019,post_data_value);
  lVar5 = 0;
  do {
    uVar8 = (int)lVar5 << 8;
    iVar10 = 8;
    do {
      uVar8 = uVar8 * 2 ^ (uint)(int)(short)uVar8 >> 0xf & 0x1021;
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
    local_250.super_Encoder.crc_generator_.
    super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>.
    xor_table[lVar5] = (unsigned_short)uVar8;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  local_250.super_Encoder.fuzzy_target_ = (vector<bool,_std::allocator<bool>_> *)0x0;
  local_250.super_Encoder._vptr_Encoder = (_func_int **)&PTR__Encoder_005a2cc0;
  local_2f0 = (in_stack_00000028 / 10 + in_stack_00000028) * 8;
  lVar5 = 0;
  for (plVar7 = *(long **)post_index_address_mark_bytes;
      plVar7 != *(long **)(post_index_address_mark_bytes + 8); plVar7 = plVar7 + 1) {
    lVar5 = lVar5 + (int)(0x80 << (*(byte *)(*plVar7 + 3) & 0x1f) | 2);
  }
  uVar6 = (ulong)((long)*(long **)(post_index_address_mark_bytes + 8) -
                 (long)*(long **)post_index_address_mark_bytes) >> 3;
  lVar1 = (lVar5 + uVar16) * 0x10 +
          ((post_address_mark_bytes + uVar15 + post_data_bytes + local_2d8) * 2 + 0x10) * uVar6 * 8;
  while ((local_2f0 <= lVar1 + 0x10U &&
         (((uVar15 != 0 || post_data_bytes != 0) || (post_address_mark_bytes != 0 || uVar16 != 0))
          || local_2d8 != 0))) {
    uVar16 = uVar16 >> 1;
    post_address_mark_bytes = post_address_mark_bytes >> 1;
    uVar15 = uVar15 >> 1;
    post_data_bytes = post_data_bytes >> 1;
    local_2d8 = local_2d8 >> 1;
    lVar1 = (((post_data_bytes + local_2d8 + post_address_mark_bytes + uVar15) * 2 + 0x10) * uVar6 +
            (uVar16 + lVar5) * 2) * 8;
  }
  local_250.super_Encoder.crc_generator_.
  super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>.value_ =
       local_250.super_Encoder.crc_generator_.
       super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>.
       xor_table[3] ^ 0xff00;
  uVar6 = 0x8000;
  local_2d0 = post_data_bytes;
  local_2c8 = post_address_mark_bytes;
  local_250.super_Encoder.target_ = &local_2a8.data;
  do {
    std::vector<bool,_std::allocator<bool>_>::push_back
              (local_250.super_Encoder.target_,(uVar6 & 0xf77a) != 0);
    uVar12 = (ushort)uVar6;
    uVar6 = uVar6 >> 1;
  } while (1 < uVar12);
  if (uVar16 != 0) {
    input = (uint8_t)local_2f8;
    do {
      FMEncoder::add_byte(&local_250,input,'\0');
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  puVar13 = *(undefined8 **)post_index_address_mark_bytes;
  local_2e0 = *(undefined8 **)(post_index_address_mark_bytes + 8);
  local_2f8 = uVar15;
  if (puVar13 != local_2e0) {
    do {
      puVar2 = (uint8_t *)*puVar13;
      for (uVar16 = local_2c8; uVar16 != 0; uVar16 = uVar16 - 1) {
        local_250.super_Encoder.crc_generator_.
        super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>.
        value_ = local_250.super_Encoder.crc_generator_.
                 super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                 .value_ << 8 ^
                 local_250.super_Encoder.crc_generator_.
                 super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                 .xor_table
                 [local_250.super_Encoder.crc_generator_.
                  super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                  .value_ >> 8];
        (*local_250.super_Encoder._vptr_Encoder[8])(&local_250,0xaaaa,0);
      }
      local_250.super_Encoder.crc_generator_.
      super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>.value_
           = local_250.super_Encoder.crc_generator_.
             super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
             .xor_table[1] ^ 0xff00;
      (*local_250.super_Encoder._vptr_Encoder[8])(&local_250,0xf57e,0);
      FMEncoder::add_byte(&local_250,*puVar2,'\0');
      FMEncoder::add_byte(&local_250,puVar2[1],'\0');
      FMEncoder::add_byte(&local_250,puVar2[2],'\0');
      FMEncoder::add_byte(&local_250,puVar2[3],'\0');
      uVar4 = local_250.super_Encoder.crc_generator_.
              super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
              .value_;
      bVar14 = puVar2[0x21];
      (*local_250.super_Encoder._vptr_Encoder[3])
                (&local_250,
                 (ulong)(local_250.super_Encoder.crc_generator_.
                         super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                         .value_ >> 8),0);
      (*local_250.super_Encoder._vptr_Encoder[3])(&local_250,(ulong)(byte)(bVar14 ^ (byte)uVar4),0);
      for (uVar16 = local_2f8; uVar15 = local_2d0, uVar16 != 0; uVar16 = uVar16 - 1) {
        FMEncoder::add_byte(&local_250,(uint8_t)pre_data_mark_bytes,'\0');
      }
      for (; uVar15 != 0; uVar15 = uVar15 - 1) {
        local_250.super_Encoder.crc_generator_.
        super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>.
        value_ = local_250.super_Encoder.crc_generator_.
                 super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                 .value_ << 8 ^
                 local_250.super_Encoder.crc_generator_.
                 super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                 .xor_table
                 [local_250.super_Encoder.crc_generator_.
                  super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                  .value_ >> 8];
        (*local_250.super_Encoder._vptr_Encoder[8])(&local_250,0xaaaa,0);
      }
      uVar16 = local_2d8;
      if (*(long *)(puVar2 + 8) != *(long *)(puVar2 + 0x10)) {
        puVar9 = local_250.super_Encoder.crc_generator_.
                 super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                 .xor_table + 4;
        if (puVar2[0x22] != 0) {
          puVar9 = local_250.super_Encoder.crc_generator_.
                   super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                   .xor_table + 7;
        }
        local_250.super_Encoder.crc_generator_.
        super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>.
        value_ = *puVar9 ^ 0xff00;
        (*local_250.super_Encoder._vptr_Encoder[8])
                  (&local_250,(ulong)((puVar2[0x22] ^ 1) * 5 + 0xf56a),0);
        bVar14 = puVar2[3];
        uVar16 = (ulong)(0x80 << (bVar14 & 0x1f));
        plVar7 = *(long **)(puVar2 + 8);
        lVar5 = *plVar7;
        if ((ulong)((*(long *)(puVar2 + 0x10) - (long)plVar7 >> 3) * -0x5555555555555555) < 2) {
          if (0x18 < bVar14 || plVar7[1] == lVar5) goto LAB_0043e128;
          uVar15 = 0;
          do {
            FMEncoder::add_byte(&local_250,*(uint8_t *)(lVar5 + uVar15),'\0');
            uVar15 = uVar15 + 1;
            lVar5 = **(long **)(puVar2 + 8);
            if ((ulong)((*(long **)(puVar2 + 8))[1] - lVar5) <= uVar15) break;
          } while (uVar15 < uVar16);
        }
        else if (0x18 < bVar14 || plVar7[1] == lVar5) {
LAB_0043e128:
          uVar15 = 0;
        }
        else {
          uVar15 = 0;
          do {
            fuzzy_mask = 0;
            bVar14 = *(byte *)(lVar5 + uVar15);
            while (plVar7 = plVar7 + 3, plVar7 != *(long **)(puVar2 + 0x10)) {
              fuzzy_mask = fuzzy_mask | *(byte *)(*plVar7 + uVar15) ^ bVar14;
              bVar14 = bVar14 & ~fuzzy_mask;
            }
            FMEncoder::add_byte(&local_250,*(byte *)(lVar5 + uVar15),fuzzy_mask);
            uVar15 = uVar15 + 1;
            plVar7 = *(long **)(puVar2 + 8);
            lVar5 = *plVar7;
          } while ((uVar15 < (ulong)(plVar7[1] - lVar5)) && (uVar15 < uVar16));
        }
        lVar5 = uVar16 - uVar15;
        if (uVar15 <= uVar16 && lVar5 != 0) {
          do {
            local_250.super_Encoder.crc_generator_.
            super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>.
            value_ = local_250.super_Encoder.crc_generator_.
                     super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                     .value_ << 8 ^
                     local_250.super_Encoder.crc_generator_.
                     super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                     .xor_table
                     [local_250.super_Encoder.crc_generator_.
                      super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                      .value_ >> 8];
            (*local_250.super_Encoder._vptr_Encoder[8])(&local_250,0xaaaa,0);
            lVar5 = lVar5 + -1;
          } while (lVar5 != 0);
        }
        uVar4 = local_250.super_Encoder.crc_generator_.
                super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                .value_;
        bVar14 = puVar2[0x20];
        (*local_250.super_Encoder._vptr_Encoder[3])
                  (&local_250,
                   (ulong)(local_250.super_Encoder.crc_generator_.
                           super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                           .value_ >> 8),0);
        (*local_250.super_Encoder._vptr_Encoder[3])
                  (&local_250,(ulong)(byte)(bVar14 ^ (byte)uVar4),0);
        uVar16 = local_2d8;
      }
      for (; uVar16 != 0; uVar16 = uVar16 - 1) {
        FMEncoder::add_byte(&local_250,(uint8_t)expected_track_bytes,'\0');
      }
      puVar13 = puVar13 + 1;
    } while (puVar13 != local_2e0);
  }
  while (uVar16 = (ulong)local_2a8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                  ((long)local_2a8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                  (long)local_2a8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8,
        uVar16 < local_2c0) {
    local_250.super_Encoder.crc_generator_.
    super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>.value_ =
         local_250.super_Encoder.crc_generator_.
         super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>.
         value_ << 8 ^
         local_250.super_Encoder.crc_generator_.
         super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>.
         xor_table[local_250.super_Encoder.crc_generator_.
                   super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                   .value_ >> 8];
    (*local_250.super_Encoder._vptr_Encoder[8])(&local_250,0xaaaa,0);
  }
  if (local_2f0 < uVar16) {
    std::vector<bool,_std::allocator<bool>_>::resize(&local_2a8.data,local_2f0,false);
  }
  local_2b8 = (PCMTrack *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Storage::Disk::PCMTrack,std::allocator<Storage::Disk::PCMTrack>,Storage::Disk::PCMSegment>
            (&_Stack_2b0,&local_2b8,(allocator<Storage::Disk::PCMTrack> *)&local_2f9,&local_2a8);
  pvVar3 = local_2e8;
  (local_2e8->
  super__Vector_base<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)local_2b8;
  (local_2e8->
  super__Vector_base<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_2b0._M_pi;
  _Var11._M_pi = extraout_RDX;
  if (local_2a8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_2a8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_2a8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_2a8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_2a8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_2a8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_offset = 0;
    local_2a8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_2a8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_2a8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_end_of_storage = (_Bit_pointer)0x0;
    _Var11._M_pi = extraout_RDX_00;
  }
  if (local_2a8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_2a8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_2a8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_2a8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    _Var11._M_pi = extraout_RDX_01;
  }
  sVar17.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  sVar17.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pvVar3;
  return (shared_ptr<Storage::Disk::Track>)
         sVar17.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Storage::Disk::Track>
		GTrackWithSectors(
			const std::vector<const Sector *> &sectors,
			std::size_t post_index_address_mark_bytes, uint8_t post_index_address_mark_value,
			std::size_t pre_address_mark_bytes,
			std::size_t post_address_mark_bytes, uint8_t post_address_mark_value,
			std::size_t pre_data_mark_bytes,
			std::size_t post_data_bytes, uint8_t post_data_value,
			std::size_t expected_track_bytes) {
	Storage::Disk::PCMSegment segment;
	segment.data.reserve(expected_track_bytes * 8);
	T shifter(segment.data);

	// Make a pre-estimate of output size, in case any of the idealised gaps
	// provided need to be shortened.
	const size_t data_size = shifter.item_size(SurfaceItem::Data);
	const size_t mark_size = shifter.item_size(SurfaceItem::Mark);
	const size_t max_size = (expected_track_bytes + (expected_track_bytes / 10)) * 8;

	size_t total_sector_bytes = 0;
	for(const auto sector : sectors) {
		total_sector_bytes += size_t(128 << sector->size) + 2;
	}

	// Seek appropriate gap sizes, if the defaults don't allow all data to fit.
	while(true) {
		const size_t size =
			mark_size +
			post_index_address_mark_bytes * data_size +
			total_sector_bytes * data_size +
			sectors.size() * (
				(pre_address_mark_bytes + 6 + post_address_mark_bytes + pre_data_mark_bytes + post_data_bytes) * data_size + 2 * mark_size
			);

		// If this track already fits, do nothing.
		if(size*8 < max_size) break;

		// If all gaps are already zero, do nothing.
		if(!post_index_address_mark_bytes && !pre_address_mark_bytes && !post_address_mark_bytes && !pre_data_mark_bytes && !post_data_bytes)
			break;

		// Very simple solution: try halving all gaps.
		post_index_address_mark_bytes >>= 1;
		pre_address_mark_bytes >>= 1;
		post_address_mark_bytes >>= 1;
		pre_data_mark_bytes >>= 1;
		post_data_bytes >>= 1;
	}

	// Output the index mark.
	shifter.add_index_address_mark();

	// Add the post-index mark.
	for(std::size_t c = 0; c < post_index_address_mark_bytes; c++) shifter.add_byte(post_index_address_mark_value);

	// Add sectors.
	for(const Sector *sector : sectors) {
		// Gap.
		for(std::size_t c = 0; c < pre_address_mark_bytes; c++) shifter.add_byte(0x00);

		// Sector header.
		shifter.add_ID_address_mark();
		shifter.add_byte(sector->address.track);
		shifter.add_byte(sector->address.side);
		shifter.add_byte(sector->address.sector);
		shifter.add_byte(sector->size);
		shifter.add_crc(sector->has_header_crc_error);

		// Gap.
		for(std::size_t c = 0; c < post_address_mark_bytes; c++) shifter.add_byte(post_address_mark_value);
		for(std::size_t c = 0; c < pre_data_mark_bytes; c++) shifter.add_byte(0x00);

		// Data, if attached.
		if(!sector->samples.empty()) {
			if(sector->is_deleted)
				shifter.add_deleted_data_address_mark();
			else
				shifter.add_data_address_mark();

			std::size_t c = 0;
			std::size_t declared_length = size_t(128 << sector->size);
			if(sector->samples.size() > 1) {
				// For each byte, mark as fuzzy any bits that differ. Which isn't exactly the
				// same thing as obeying the multiple samples, as it discards the implied
				// probabilities of different values.
				for(c = 0; c < sector->samples[0].size() && c < declared_length; c++) {
					auto sample_iterator = sector->samples.begin();
					uint8_t value = (*sample_iterator)[c], fuzzy_mask = 0;

					++sample_iterator;
					while(sample_iterator != sector->samples.end()) {
						// Mark as fuzzy any bits that differ here from the
						// canonical value, and zero them out in the original.
						// That might cause them to retrigger, but who cares?
						fuzzy_mask |= value ^ (*sample_iterator)[c];
						value &= ~fuzzy_mask;

						++sample_iterator;
					}
					shifter.add_byte(sector->samples[0][c], fuzzy_mask);
				}
			} else {
				for(c = 0; c < sector->samples[0].size() && c < declared_length; c++) {
					shifter.add_byte(sector->samples[0][c]);
				}
			}
			for(; c < declared_length; c++) {
				shifter.add_byte(0x00);
			}
			shifter.add_crc(sector->has_data_crc_error);
		}

		// Gap.
		for(std::size_t c = 0; c < post_data_bytes; c++) shifter.add_byte(post_data_value);
	}

	while(segment.data.size() < expected_track_bytes*8) shifter.add_byte(0x00);

	// Allow the amount of data written to be up to 10% more than the expected size. Which is generous.
	if(segment.data.size() > max_size) segment.data.resize(max_size);

	return std::make_shared<Storage::Disk::PCMTrack>(std::move(segment));
}